

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O2

void __thiscall
booster::aio::event_loop_impl::io_event_canceler::operator()(io_event_canceler *this)

{
  refcounted *prVar1;
  event_loop_impl *peVar2;
  error_category *peVar3;
  callable<void_(const_std::error_code_&)> *r;
  io_data *piVar4;
  lock_guard l;
  undefined4 uStack_5c;
  unique_lock<std::recursive_mutex> local_50;
  completion_handler local_40;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_50,&this->self_->data_mutex_);
  piVar4 = socket_map<booster::aio::event_loop_impl::io_data>::operator[]
                     (&this->self_->map_,this->fd);
  piVar4->current_event = 0;
  std::_V2::system_category();
  reactor::remove((this->self_->reactor_)._M_t.
                  super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
                  .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl,
                  (char *)(ulong)(uint)this->fd);
  peVar3 = aio_error_cat;
  prVar1 = &((piVar4->readable).call_ptr.p_)->super_refcounted;
  if (prVar1 != (refcounted *)0x0) {
    peVar2 = this->self_;
    (piVar4->readable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
    local_40.e._4_4_ = uStack_5c;
    local_40.e._M_value = 1;
    local_40.e._M_cat = peVar3;
    local_40.n = 0;
    local_40.type = completion_handler::op_event_handler;
    local_40.h.p_ = prVar1;
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::emplace_back<booster::aio::event_loop_impl::completion_handler>
              (&peVar2->dispatch_queue_,&local_40);
    intrusive_ptr<booster::refcounted>::~intrusive_ptr(&local_40.h);
  }
  prVar1 = &((piVar4->writeable).call_ptr.p_)->super_refcounted;
  if (prVar1 != (refcounted *)0x0) {
    peVar2 = this->self_;
    (piVar4->writeable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
    local_40.e._4_4_ = uStack_5c;
    local_40.e._M_value = 1;
    local_40.e._M_cat = peVar3;
    local_40.n = 0;
    local_40.type = completion_handler::op_event_handler;
    local_40.h.p_ = prVar1;
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::emplace_back<booster::aio::event_loop_impl::completion_handler>
              (&peVar2->dispatch_queue_,&local_40);
    intrusive_ptr<booster::refcounted>::~intrusive_ptr(&local_40.h);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  return;
}

Assistant:

void operator()() const
		{
			lock_guard l(self_->data_mutex_);
			
			io_data &cont=self_->map_[fd];
			cont.current_event = 0;
			system::error_code e;
			self_->reactor_->remove(fd,e);
			e = system::error_code(aio_error::canceled,aio_error_cat);
			// Maybe it is closed
			if(cont.readable)
				self_->dispatch_queue_.push_back(completion_handler(cont.readable,e));
			if(cont.writeable)
				self_->dispatch_queue_.push_back(completion_handler(cont.writeable,e));
			self_->map_.erase(fd);
		}